

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O1

bool __thiscall bloom_parameters::compute_optimal_parameters(bloom_parameters *this)

{
  unsigned_long_long uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  ulong uVar15;
  
  bVar10 = true;
  if ((((this->minimum_size <= this->maximum_size) &&
       (this->minimum_number_of_hashes - 1 < this->maximum_number_of_hashes)) &&
      (this->projected_element_count != 0)) &&
     (dVar2 = this->false_positive_probability, dVar14 = ABS(dVar2),
     (0x3fe < (uint)((long)dVar14 + 0xfff0000000000000U >> 0x35) || -1 < (long)dVar2) &&
     (dVar14 != INFINITY && (0xffffffffffffe < (long)dVar14 - 1U || -1 < (long)dVar2)))) {
    bVar10 = this->random_seed + 1 < 2;
  }
  if (!bVar10) {
    dVar13 = 1.0;
    dVar14 = 0.0;
    uVar15 = 0;
    iVar9 = 999;
    dVar2 = INFINITY;
    do {
      uVar1 = this->projected_element_count;
      dVar4 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
      dVar11 = pow(this->false_positive_probability,1.0 / dVar13);
      dVar11 = log(1.0 - dVar11);
      dVar11 = ((dVar4 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * -dVar13)
               / dVar11;
      auVar12._0_8_ = ~-(ulong)(dVar11 < dVar2) & (ulong)dVar14;
      auVar12._8_8_ = ~(ulong)dVar4 & uVar15;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = -(ulong)(dVar11 < dVar2) & (ulong)dVar13;
      if (dVar2 <= dVar11) {
        dVar11 = dVar2;
      }
      dVar13 = dVar13 + 1.0;
      dVar14 = SUB168(auVar12 | auVar3,0);
      uVar15 = SUB168(auVar12 | auVar3,8);
      iVar9 = iVar9 + -1;
      dVar2 = dVar11;
    } while (iVar9 != 0);
    uVar5 = (uint)(long)dVar14;
    (this->optimal_parameters).number_of_hashes = uVar5;
    uVar15 = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
    uVar6 = (ulong)((uint)uVar15 & 7);
    lVar7 = 8 - uVar6;
    if (uVar6 == 0) {
      lVar7 = 0;
    }
    uVar15 = lVar7 + uVar15;
    (this->optimal_parameters).table_size = uVar15;
    uVar8 = this->minimum_number_of_hashes;
    if ((uVar5 < uVar8) || (uVar8 = this->maximum_number_of_hashes, uVar8 < uVar5)) {
      (this->optimal_parameters).number_of_hashes = uVar8;
    }
    uVar6 = this->minimum_size;
    if ((uVar15 < uVar6) || (uVar6 = this->maximum_size, uVar6 < uVar15)) {
      (this->optimal_parameters).table_size = uVar6;
    }
  }
  return (bool)(bVar10 ^ 1);
}

Assistant:

virtual bool compute_optimal_parameters()
   {
      /*
        Note:
        The following will attempt to find the number of hash functions
        and minimum amount of storage bits required to construct a bloom
        filter consistent with the user defined false positive probability
        and estimated element insertion count.
      */

      if (!(*this))
         return false;

      double min_m  = std::numeric_limits<double>::infinity();
      double min_k  = 0.0;
      double k      = 1.0;

      while (k < 1000.0)
      {
         const double numerator   = (- k * projected_element_count);
         const double denominator = std::log(1.0 - std::pow(false_positive_probability, 1.0 / k));

         const double curr_m = numerator / denominator;

         if (curr_m < min_m)
         {
            min_m = curr_m;
            min_k = k;
         }

         k += 1.0;
      }

      optimal_parameters_t& optp = optimal_parameters;

      optp.number_of_hashes = static_cast<unsigned int>(min_k);

      optp.table_size = static_cast<unsigned long long int>(min_m);

      optp.table_size += (((optp.table_size % bits_per_char) != 0) ? (bits_per_char - (optp.table_size % bits_per_char)) : 0);

      if (optp.number_of_hashes < minimum_number_of_hashes)
         optp.number_of_hashes = minimum_number_of_hashes;
      else if (optp.number_of_hashes > maximum_number_of_hashes)
         optp.number_of_hashes = maximum_number_of_hashes;

      if (optp.table_size < minimum_size)
         optp.table_size = minimum_size;
      else if (optp.table_size > maximum_size)
         optp.table_size = maximum_size;

      return true;
   }